

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_xyz_grad(REF_DBL **xyzs,REF_DBL *scalar,REF_DBL *gradient)

{
  double local_f8;
  double local_e8;
  double local_e0;
  double local_d0;
  double local_c8;
  double local_b8;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL *xyz2;
  REF_DBL *xyz1;
  REF_DBL *xyz0;
  REF_DBL norm3 [3];
  double local_68;
  REF_DBL norm2 [3];
  double local_48;
  REF_DBL norm1 [3];
  REF_DBL vol;
  REF_DBL *gradient_local;
  REF_DBL *scalar_local;
  REF_DBL **xyzs_local;
  
  *gradient = 0.0;
  gradient[1] = 0.0;
  gradient[2] = 0.0;
  xyzs_local._4_4_ = ref_node_xyz_vol(xyzs,norm1 + 2);
  if (xyzs_local._4_4_ == 0) {
    norm1[2] = norm1[2] * -6.0;
    xyzs_local._4_4_ = ref_node_xyz_normal(*xyzs,xyzs[3],xyzs[2],&local_48);
    if (xyzs_local._4_4_ == 0) {
      xyzs_local._4_4_ = ref_node_xyz_normal(*xyzs,xyzs[1],xyzs[3],&local_68);
      if (xyzs_local._4_4_ == 0) {
        xyzs_local._4_4_ = ref_node_xyz_normal(*xyzs,xyzs[2],xyzs[1],(REF_DBL *)&xyz0);
        if (xyzs_local._4_4_ == 0) {
          *gradient = (scalar[3] - *scalar) * (double)xyz0 +
                      (scalar[1] - *scalar) * local_48 + (scalar[2] - *scalar) * local_68;
          gradient[1] = (scalar[3] - *scalar) * norm3[0] +
                        (scalar[1] - *scalar) * norm1[0] + (scalar[2] - *scalar) * norm2[0];
          gradient[2] = (scalar[3] - *scalar) * norm3[1] +
                        (scalar[1] - *scalar) * norm1[1] + (scalar[2] - *scalar) * norm2[1];
          if (norm1[2] * 1e+20 <= 0.0) {
            local_b8 = -(norm1[2] * 1e+20);
          }
          else {
            local_b8 = norm1[2] * 1e+20;
          }
          if (*gradient <= 0.0) {
            local_c8 = -*gradient;
          }
          else {
            local_c8 = *gradient;
          }
          if (local_c8 < local_b8) {
            if (norm1[2] * 1e+20 <= 0.0) {
              local_d0 = -(norm1[2] * 1e+20);
            }
            else {
              local_d0 = norm1[2] * 1e+20;
            }
            if (gradient[1] <= 0.0) {
              local_e0 = -gradient[1];
            }
            else {
              local_e0 = gradient[1];
            }
            if (local_e0 < local_d0) {
              if (norm1[2] * 1e+20 <= 0.0) {
                local_e8 = -(norm1[2] * 1e+20);
              }
              else {
                local_e8 = norm1[2] * 1e+20;
              }
              if (gradient[2] <= 0.0) {
                local_f8 = -gradient[2];
              }
              else {
                local_f8 = gradient[2];
              }
              if (local_f8 < local_e8) {
                *gradient = *gradient / norm1[2];
                gradient[1] = gradient[1] / norm1[2];
                gradient[2] = gradient[2] / norm1[2];
                return 0;
              }
            }
          }
          *gradient = 0.0;
          gradient[1] = 0.0;
          gradient[2] = 0.0;
          xyzs_local._4_4_ = 4;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0xc78,"ref_node_xyz_grad",(ulong)xyzs_local._4_4_,"vol");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0xc73,"ref_node_xyz_grad",(ulong)xyzs_local._4_4_,"vol");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xc6e,
             "ref_node_xyz_grad",(ulong)xyzs_local._4_4_,"vol");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xc68,
           "ref_node_xyz_grad",(ulong)xyzs_local._4_4_,"vol");
  }
  return xyzs_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_node_xyz_grad(REF_DBL *xyzs[4], REF_DBL *scalar,
                                     REF_DBL *gradient) {
  REF_DBL vol, norm1[3], norm2[3], norm3[3];
  REF_DBL *xyz0, *xyz1, *xyz2;

  gradient[0] = 0.0;
  gradient[1] = 0.0;
  gradient[2] = 0.0;

  RSS(ref_node_xyz_vol(xyzs, &vol), "vol");
  vol *= -6.0;

  xyz0 = xyzs[0];
  xyz1 = xyzs[3];
  xyz2 = xyzs[2];
  RSS(ref_node_xyz_normal(xyz0, xyz1, xyz2, norm1), "vol");

  xyz0 = xyzs[0];
  xyz1 = xyzs[1];
  xyz2 = xyzs[3];
  RSS(ref_node_xyz_normal(xyz0, xyz1, xyz2, norm2), "vol");

  xyz0 = xyzs[0];
  xyz1 = xyzs[2];
  xyz2 = xyzs[1];
  RSS(ref_node_xyz_normal(xyz0, xyz1, xyz2, norm3), "vol");

  gradient[0] = (scalar[1] - scalar[0]) * norm1[0] +
                (scalar[2] - scalar[0]) * norm2[0] +
                (scalar[3] - scalar[0]) * norm3[0];
  gradient[1] = (scalar[1] - scalar[0]) * norm1[1] +
                (scalar[2] - scalar[0]) * norm2[1] +
                (scalar[3] - scalar[0]) * norm3[1];
  gradient[2] = (scalar[1] - scalar[0]) * norm1[2] +
                (scalar[2] - scalar[0]) * norm2[2] +
                (scalar[3] - scalar[0]) * norm3[2];

  if (ref_math_divisible(gradient[0], vol) &&
      ref_math_divisible(gradient[1], vol) &&
      ref_math_divisible(gradient[2], vol)) {
    gradient[0] /= vol;
    gradient[1] /= vol;
    gradient[2] /= vol;
  } else {
    gradient[0] = 0.0;
    gradient[1] = 0.0;
    gradient[2] = 0.0;
    return REF_DIV_ZERO;
  }

  return REF_SUCCESS;
}